

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall
ClipperLib::PolyOffsetBuilder::PolyOffsetBuilder
          (PolyOffsetBuilder *this,Polygons *in_polys,Polygons *out_polys,double delta,
          JoinType jointype,double MiterLimit)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  size_type sVar7;
  reference pvVar8;
  const_reference pvVar9;
  reference pvVar10;
  const_reference pvVar11;
  const_reference pvVar12;
  reference pvVar13;
  DoublePoint DVar14;
  __normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
  local_200;
  const_iterator local_1f8;
  IntPoint local_1f0;
  IntPoint local_1e0;
  IntPoint local_1d0;
  IntPoint local_1c0;
  allocator<ClipperLib::IntPoint> local_1a9;
  undefined1 local_1a8 [8];
  Polygon outer;
  IntRect r;
  Clipper clpr;
  Polygon local_90;
  undefined1 local_78 [8];
  Polygon arc;
  double a1;
  size_t len;
  double deltaSq;
  double local_38;
  double MiterLimit_local;
  JoinType jointype_local;
  double delta_local;
  Polygons *out_polys_local;
  Polygons *in_polys_local;
  PolyOffsetBuilder *this_local;
  
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::vector(&this->m_p);
  std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::vector
            (&this->normals);
  if ((delta <= -1e-20) || (1e-20 <= delta)) {
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::operator=(&this->m_p,in_polys);
    this->m_delta = delta;
    this->m_jointype = jointype;
    local_38 = MiterLimit;
    if (MiterLimit <= 1.0) {
      local_38 = 1.0;
    }
    this->m_RMin = 2.0 / (local_38 * local_38);
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::clear(out_polys);
    sVar7 = std::
            vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            ::size(in_polys);
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::resize(out_polys,sVar7);
    this->m_i = 0;
    while (uVar4 = this->m_i,
          sVar7 = std::
                  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                  ::size(in_polys), uVar4 < sVar7) {
      pvVar8 = std::
               vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
               ::operator[](out_polys,this->m_i);
      this->m_curr_poly = pvVar8;
      pvVar9 = std::
               vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
               ::operator[](in_polys,this->m_i);
      a1 = (double)std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::size
                             (pvVar9);
      if (1 < (ulong)a1) {
        pvVar8 = std::
                 vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                 ::operator[](&this->m_p,this->m_i);
        pvVar10 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                  operator[](pvVar8,0);
        lVar5 = pvVar10->X;
        pvVar8 = std::
                 vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                 ::operator[](&this->m_p,this->m_i);
        pvVar10 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                  operator[](pvVar8,(long)a1 - 1);
        if (lVar5 == pvVar10->X) {
          pvVar8 = std::
                   vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                   ::operator[](&this->m_p,this->m_i);
          pvVar10 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                    operator[](pvVar8,0);
          lVar5 = pvVar10->Y;
          pvVar8 = std::
                   vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                   ::operator[](&this->m_p,this->m_i);
          pvVar10 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                    operator[](pvVar8,(long)a1 - 1);
          if (lVar5 == pvVar10->Y) {
            a1 = (double)((long)a1 - 1);
          }
        }
      }
      pvVar9 = std::
               vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
               ::operator[](in_polys,this->m_i);
      arc.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)Area(pvVar9);
      if (0.0 <= delta) {
        if (((double)arc.
                     super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage < 0.0) &&
           (-(double)arc.
                     super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage <
            delta * delta * 3.141592653589793)) {
          a1 = 0.0;
        }
      }
      else if ((0.0 < (double)arc.
                              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage) &&
              ((double)arc.
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage <
               delta * delta * 3.141592653589793)) {
        a1 = 0.0;
      }
      if ((a1 != 0.0) && ((2 < (ulong)a1 || (0.0 < delta)))) {
        if (a1 == 4.94065645841247e-324) {
          std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                    ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)local_78
                    );
          pvVar9 = std::
                   vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                   ::operator[](in_polys,this->m_i);
          pvVar11 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                    operator[](pvVar9,0);
          BuildArc(&local_90,pvVar11,0.0,6.283185307179586,delta);
          std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator=
                    ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)local_78
                     ,&local_90);
          std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector
                    (&local_90);
          pvVar8 = std::
                   vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                   ::operator[](out_polys,this->m_i);
          std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator=
                    (pvVar8,(vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                            local_78);
          std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector
                    ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)local_78
                    );
        }
        else {
          std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::clear
                    (&this->normals);
          std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::resize
                    (&this->normals,(size_type)a1);
          pvVar9 = std::
                   vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                   ::operator[](in_polys,this->m_i);
          pvVar11 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                    operator[](pvVar9,(long)a1 - 1);
          pvVar9 = std::
                   vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                   ::operator[](in_polys,this->m_i);
          pvVar12 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                    operator[](pvVar9,0);
          DVar14 = GetUnitNormal(pvVar11,pvVar12);
          pvVar13 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
                    operator[](&this->normals,(long)a1 - 1);
          pvVar13->X = DVar14.X;
          pvVar13->Y = DVar14.Y;
          this->m_j = 0;
          while (this->m_j < (long)a1 - 1U) {
            pvVar9 = std::
                     vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                     ::operator[](in_polys,this->m_i);
            pvVar11 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                      operator[](pvVar9,this->m_j);
            pvVar9 = std::
                     vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                     ::operator[](in_polys,this->m_i);
            pvVar12 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                      operator[](pvVar9,this->m_j + 1);
            DVar14 = GetUnitNormal(pvVar11,pvVar12);
            pvVar13 = std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                      ::operator[](&this->normals,this->m_j);
            pvVar13->X = DVar14.X;
            pvVar13->Y = DVar14.Y;
            this->m_j = this->m_j + 1;
          }
          this->m_k = (long)a1 - 1;
          this->m_j = 0;
          while (this->m_j < (ulong)a1) {
            if (jointype == jtSquare) {
              DoSquare(this,1.0);
            }
            else if (jointype == jtRound) {
              DoRound(this);
            }
            else if (jointype == jtMiter) {
              pvVar13 = std::
                        vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
                        operator[](&this->normals,this->m_j);
              dVar1 = pvVar13->X;
              pvVar13 = std::
                        vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
                        operator[](&this->normals,this->m_k);
              dVar2 = pvVar13->X;
              pvVar13 = std::
                        vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
                        operator[](&this->normals,this->m_j);
              dVar3 = pvVar13->Y;
              pvVar13 = std::
                        vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
                        operator[](&this->normals,this->m_k);
              this->m_R = dVar1 * dVar2 + dVar3 * pvVar13->Y + 1.0;
              if (this->m_R < this->m_RMin) {
                DoSquare(this,local_38);
              }
              else {
                DoMiter(this);
              }
            }
            this->m_k = this->m_j;
            this->m_j = this->m_j + 1;
          }
        }
      }
      this->m_i = this->m_i + 1;
    }
    Clipper::Clipper((Clipper *)&r.bottom);
    ClipperBase::AddPolygons
              ((ClipperBase *)((long)&r.bottom + *(long *)(r.bottom + -0x18)),out_polys,ptSubject);
    if (delta <= 0.0) {
      ClipperBase::GetBounds
                ((IntRect *)
                 &outer.
                  super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (ClipperBase *)((long)&r.bottom + *(long *)(r.bottom + -0x18)));
      std::allocator<ClipperLib::IntPoint>::allocator(&local_1a9);
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)local_1a8,4,
                 &local_1a9);
      std::allocator<ClipperLib::IntPoint>::~allocator(&local_1a9);
      IntPoint::IntPoint(&local_1c0,
                         (long64)((long)&outer.
                                         super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage[-1].X +
                                 6),r.right + 10);
      pvVar10 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                          ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                           local_1a8,0);
      pvVar10->X = local_1c0.X;
      pvVar10->Y = local_1c0.Y;
      IntPoint::IntPoint(&local_1d0,r.top + 10,r.right + 10);
      pvVar10 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                          ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                           local_1a8,1);
      pvVar10->X = local_1d0.X;
      pvVar10->Y = local_1d0.Y;
      IntPoint::IntPoint(&local_1e0,r.top + 10,r.left + -10);
      pvVar10 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                          ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                           local_1a8,2);
      pvVar10->X = local_1e0.X;
      pvVar10->Y = local_1e0.Y;
      IntPoint::IntPoint(&local_1f0,
                         (long64)((long)&outer.
                                         super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage[-1].X +
                                 6),r.left + -10);
      pvVar10 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                          ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                           local_1a8,3);
      pvVar10->X = local_1f0.X;
      pvVar10->Y = local_1f0.Y;
      ClipperBase::AddPolygon
                ((ClipperBase *)((long)&r.bottom + *(long *)(r.bottom + -0x18)),
                 (vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)local_1a8,
                 ptSubject);
      bVar6 = Clipper::Execute((Clipper *)&r.bottom,ctUnion,out_polys,pftNegative,pftNegative);
      if (bVar6) {
        local_200._M_current =
             (vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
             std::
             vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
             ::begin(out_polys);
        __gnu_cxx::
        __normal_iterator<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>const*,std::vector<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>,std::allocator<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>>
        ::__normal_iterator<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>*>
                  ((__normal_iterator<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>const*,std::vector<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>,std::allocator<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>>
                    *)&local_1f8,&local_200);
        std::
        vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        ::erase(out_polys,local_1f8);
        ReversePolygons(out_polys);
      }
      else {
        std::
        vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        ::clear(out_polys);
      }
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector
                ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)local_1a8);
    }
    else {
      bVar6 = Clipper::Execute((Clipper *)&r.bottom,ctUnion,out_polys,pftPositive,pftPositive);
      if (!bVar6) {
        std::
        vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        ::clear(out_polys);
      }
    }
    Clipper::~Clipper((Clipper *)&r.bottom);
  }
  else {
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::operator=(out_polys,in_polys);
  }
  return;
}

Assistant:

PolyOffsetBuilder(const Polygons& in_polys, Polygons& out_polys,
  double delta, JoinType jointype, double MiterLimit)
{
    //nb precondition - out_polys != ptsin_polys
    if (NEAR_ZERO(delta))
    {
        out_polys = in_polys;
        return;
    }

    this->m_p = in_polys;
    this->m_delta = delta;
    this->m_jointype = jointype;
    if (MiterLimit <= 1) MiterLimit = 1;
    m_RMin = 2/(MiterLimit*MiterLimit);
 
    double deltaSq = delta*delta;
    out_polys.clear();
    out_polys.resize(in_polys.size());
    for (m_i = 0; m_i < in_polys.size(); m_i++)
    {
        m_curr_poly = &out_polys[m_i];
        size_t len = in_polys[m_i].size();
        if (len > 1 && m_p[m_i][0].X == m_p[m_i][len - 1].X &&
            m_p[m_i][0].Y == m_p[m_i][len-1].Y) len--;

        //when 'shrinking' polygons - to minimize artefacts
        //strip those polygons that have an area < pi * delta^2 ...
        double a1 = Area(in_polys[m_i]);
        if (delta < 0) { if (a1 > 0 && a1 < deltaSq *pi) len = 0; }
        else if (a1 < 0 && -a1 < deltaSq *pi) len = 0; //holes have neg. area

        if (len == 0 || (len < 3 && delta <= 0))
          continue;
        else if (len == 1)
        {
            Polygon arc;
            arc = BuildArc(in_polys[m_i][len-1], 0, 2 * pi, delta);
            out_polys[m_i] = arc;
            continue;
        }

        //build normals ...
        normals.clear();
        normals.resize(len);
        normals[len-1] = GetUnitNormal(in_polys[m_i][len-1], in_polys[m_i][0]);
        for (m_j = 0; m_j < len -1; ++m_j)
            normals[m_j] = GetUnitNormal(in_polys[m_i][m_j], in_polys[m_i][m_j+1]);
        
        m_k = len -1;
        for (m_j = 0; m_j < len; ++m_j)
        {
          switch (jointype)
          {
            case jtMiter:
            {
              m_R = 1 + (normals[m_j].X*normals[m_k].X + 
                normals[m_j].Y*normals[m_k].Y);
              if (m_R >= m_RMin) DoMiter(); else DoSquare(MiterLimit);
              break;
            }
            case jtSquare: DoSquare(); break;
            case jtRound: DoRound(); break;
          }
        m_k = m_j;
        }
    }

    //finally, clean up untidy corners using Clipper ...
    Clipper clpr;
    clpr.AddPolygons(out_polys, ptSubject);
    if (delta > 0)
    {
        if (!clpr.Execute(ctUnion, out_polys, pftPositive, pftPositive))
            out_polys.clear();
    }
    else
    {
        IntRect r = clpr.GetBounds();
        Polygon outer(4);
        outer[0] = IntPoint(r.left - 10, r.bottom + 10);
        outer[1] = IntPoint(r.right + 10, r.bottom + 10);
        outer[2] = IntPoint(r.right + 10, r.top - 10);
        outer[3] = IntPoint(r.left - 10, r.top - 10);

        clpr.AddPolygon(outer, ptSubject);
        if (clpr.Execute(ctUnion, out_polys, pftNegative, pftNegative))
        {
            out_polys.erase(out_polys.begin());
            ReversePolygons(out_polys);

        } else
            out_polys.clear();
    }
}